

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMultiMap<QFontCache::Key,_QFontCache::Engine>::find
          (QMultiMap<QFontCache::Key,_QFontCache::Engine> *this,Key *key)

{
  bool bVar1;
  long in_FS_OFFSET;
  QMultiMap<QFontCache::Key,_QFontCache::Engine> copy;
  iterator in_stack_ffffffffffffffb8;
  QMultiMap<QFontCache::Key,_QFontCache::Engine> *in_stack_ffffffffffffffc0;
  undefined1 *local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffffc0->d);
  if (bVar1) {
    QMultiMap(in_stack_ffffffffffffffc0,
              (QMultiMap<QFontCache::Key,_QFontCache::Engine> *)in_stack_ffffffffffffffb8._M_node);
  }
  else {
    memset(&local_18,0,8);
    QMultiMap((QMultiMap<QFontCache::Key,_QFontCache::Engine> *)0x71dfad);
  }
  detach(in_stack_ffffffffffffffc0);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>_>
                *)0x71dfc1);
  std::
  multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>
  ::find((multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>
          *)in_stack_ffffffffffffffb8._M_node,(key_type *)0x71dfd2);
  iterator::iterator((iterator *)0x71dfe6,in_stack_ffffffffffffffb8);
  ~QMultiMap((QMultiMap<QFontCache::Key,_QFontCache::Engine> *)0x71dff0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)(iterator)local_10._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator find(const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMultiMap(); // keep `key` alive across the detach
        detach();
        return iterator(d->m.find(key));
    }